

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

object_iterator __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::try_emplace<int>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          object_iterator hint,string_view_type *name,int *args)

{
  object_iterator hint_00;
  json_storage_kind jVar1;
  type tVar2;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 in_RSI;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_RDI;
  string_view_type *in_R8;
  object_iterator oVar4;
  object_iterator oVar5;
  int *in_stack_000000b0;
  string_view_type *in_stack_000000b8;
  sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_000000c0;
  iterator in_stack_000000c8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  char *in_stack_ffffffffffffff98;
  not_an_object *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffc0;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  local_10;
  
  jVar1 = storage_kind((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_RDI._M_current);
  if (jVar1 == empty_object) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    create_object_implicitly<std::allocator<char>>(in_stack_ffffffffffffff60);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              (in_stack_ffffffffffffff60);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::value_abi_cxx11_
              ((object_storage *)in_stack_ffffffffffffffa0);
    detail::random_access_iterator_wrapper::operator_cast_to___normal_iterator
              ((random_access_iterator_wrapper *)&stack0xffffffffffffffe0);
    tVar2 = sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
            ::try_emplace<std::allocator<char>,int>
                      (in_stack_000000c0,in_stack_000000c8,in_stack_000000b8,in_stack_000000b0);
    detail::
    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
    ::random_access_iterator_wrapper
              (&local_10,
               (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                )tVar2._M_current);
    oVar4._8_8_ = extraout_RDX;
    oVar4.it_._M_current = local_10.it_._M_current;
  }
  else if (jVar1 == json_reference) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffff60);
    json_reference_storage::value((json_reference_storage *)0xb852cb);
    hint_00._8_8_ = in_RSI;
    hint_00.it_._M_current = in_RDI._M_current;
    oVar4 = try_emplace<int>((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_RCX,hint_00,in_R8,in_stack_ffffffffffffffc0);
    local_10.has_value_ = oVar4.has_value_;
  }
  else {
    if (jVar1 != object) {
      uVar3 = __cxa_allocate_exception(0x58);
      std::basic_string_view<char,_std::char_traits<char>_>::data(in_RCX);
      std::basic_string_view<char,_std::char_traits<char>_>::length(in_RCX);
      not_an_object::not_an_object<char>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90));
      __cxa_throw(uVar3,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              (in_stack_ffffffffffffff60);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::value_abi_cxx11_
              ((object_storage *)in_stack_ffffffffffffffa0);
    detail::random_access_iterator_wrapper::operator_cast_to___normal_iterator
              ((random_access_iterator_wrapper *)&stack0xffffffffffffffe0);
    tVar2 = sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
            ::try_emplace<std::allocator<char>,int>
                      (in_stack_000000c0,in_stack_000000c8,in_stack_000000b8,in_stack_000000b0);
    detail::
    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
    ::random_access_iterator_wrapper
              (&local_10,
               (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                )tVar2._M_current);
    oVar4._8_8_ = extraout_RDX_00;
    oVar4.it_._M_current = local_10.it_._M_current;
  }
  local_10.it_ = oVar4.it_._M_current;
  oVar5._9_7_ = oVar4._9_7_;
  oVar5.has_value_ = local_10.has_value_;
  oVar5.it_._M_current = local_10.it_._M_current;
  return oVar5;
}

Assistant:

object_iterator try_emplace(object_iterator hint, const string_view_type& name, Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    create_object_implicitly();
                    return object_iterator(cast<object_storage>().value().try_emplace(hint, name, std::forward<Args>(args)...));
                case json_storage_kind::object:
                    return object_iterator(cast<object_storage>().value().try_emplace(hint, name, std::forward<Args>(args)...));
                case json_storage_kind::json_reference:
                    return object_iterator(cast<json_reference_storage>().value().try_emplace(hint, name, std::forward<Args>(args)...));
                default:
                    JSONCONS_THROW(not_an_object(name.data(),name.length()));
            }
        }